

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  bool local_89;
  long local_88;
  long local_80;
  long local_78;
  empty_type local_65;
  dxt1_solution_coordinates local_64;
  undefined1 local_60 [8];
  insert_result solution_res;
  uint64 bError;
  uint64 gError;
  uint64 rError;
  byte local_28;
  byte local_27;
  byte local_26;
  color_quad_u8 c1;
  color_quad_u8 c0;
  bool alternate_rounding_local;
  dxt1_solution_coordinates *coords_local;
  dxt1_endpoint_optimizer *this_local;
  
  c1.field_0.field_0.a = alternate_rounding;
  dxt1_block::unpack_color((dxt1_block *)&stack0xffffffffffffffd8,coords->m_low_color,false,0xff);
  dxt1_block::unpack_color((dxt1_block *)((long)&rError + 4),coords->m_high_color,false,0xff);
  if (local_28 < rError._4_1_) {
    local_78 = this->m_rDist[local_28].low + this->m_rDist[rError._4_1_].high;
  }
  else {
    local_78 = this->m_rDist[local_28].high + this->m_rDist[rError._4_1_].low;
  }
  if (local_27 < rError._5_1_) {
    local_80 = this->m_gDist[local_27].low + this->m_gDist[rError._5_1_].high;
  }
  else {
    local_80 = this->m_gDist[local_27].high + this->m_gDist[rError._5_1_].low;
  }
  if (local_26 < rError._6_1_) {
    local_88 = this->m_bDist[local_26].low + this->m_bDist[rError._6_1_].high;
  }
  else {
    local_88 = this->m_bDist[local_26].high + this->m_bDist[rError._6_1_].low;
  }
  solution_res._16_8_ = local_88;
  if ((ulong)(local_78 + local_80 + local_88) < (this->m_best_solution).m_error) {
    if ((c1.field_0.field_0.a & 1) == 0) {
      local_64 = *coords;
      hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert((insert_result *)local_60,&this->m_solutions_tried,(uint *)&local_64,&local_65);
      if (((byte)solution_res.first.m_index & 1) == 0) {
        return false;
      }
    }
    if ((this->m_evaluate_hc & 1U) == 0) {
      if (this->m_pParams->m_quality < cCRNDXTQualityBetter) {
        this_local._7_1_ = evaluate_solution_fast(this,coords,(bool)(c1.field_0.field_0.a & 1));
      }
      else {
        this_local._7_1_ = evaluate_solution_uber(this,coords,(bool)(c1.field_0.field_0.a & 1));
      }
    }
    else {
      if ((this->m_perceptual & 1U) == 0) {
        local_89 = evaluate_solution_hc_uniform(this,coords,(bool)(c1.field_0.field_0.a & 1));
      }
      else {
        local_89 = evaluate_solution_hc_perceptual(this,coords,(bool)(c1.field_0.field_0.a & 1));
      }
      this_local._7_1_ = local_89;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, false);
        color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, false);
        uint64 rError = c0.r < c1.r ? m_rDist[c0.r].low + m_rDist[c1.r].high : m_rDist[c0.r].high + m_rDist[c1.r].low;
        uint64 gError = c0.g < c1.g ? m_gDist[c0.g].low + m_gDist[c1.g].high : m_gDist[c0.g].high + m_gDist[c1.g].low;
        uint64 bError = c0.b < c1.b ? m_bDist[c0.b].low + m_bDist[c1.b].high : m_bDist[c0.b].high + m_bDist[c1.b].low;
        if (rError + gError + bError >= m_best_solution.m_error)
        {
            return false;
        }
        if (!alternate_rounding)
        {
            solution_hash_map::insert_result solution_res(m_solutions_tried.insert(coords.m_low_color | coords.m_high_color << 16));
            if (!solution_res.second)
            {
                return false;
            }
        }
        if (m_evaluate_hc)
        {
            return m_perceptual ? evaluate_solution_hc_perceptual(coords, alternate_rounding) : evaluate_solution_hc_uniform(coords, alternate_rounding);
        }
        if (m_pParams->m_quality >= cCRNDXTQualityBetter)
        {
            return evaluate_solution_uber(coords, alternate_rounding);
        }
        return evaluate_solution_fast(coords, alternate_rounding);
    }